

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fProgramStateQueryTests.cpp
# Opt level: O3

IterateResult __thiscall
deqp::gles31::Functional::anon_unknown_1::ProgramSeparableCase::iterate(ProgramSeparableCase *this)

{
  pointer pcVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  TestLog *pTVar3;
  int iVar4;
  GLenum GVar5;
  undefined4 extraout_var;
  TestError *pTVar6;
  TestContext *code;
  ScopedLogSection section;
  int linkStatus;
  CallLogWrapper gl;
  Program program;
  char *fragSourcePtr;
  string fragTemplate;
  string vtxTemplate;
  string fStr;
  string vStr;
  Shader vtxShader;
  char *vtxSourcePtr;
  ResultCollector result;
  Shader frgShader;
  ScopedLogSection local_260;
  string local_258;
  CallLogWrapper local_238;
  undefined1 local_220 [64];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_1e0;
  Context *local_1d8 [2];
  undefined1 local_1c8 [16];
  ContextInfo *local_1b8;
  undefined1 local_1a8 [32];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_188;
  string local_178;
  undefined1 local_158 [88];
  bool local_100;
  pointer local_f0;
  ResultCollector local_e8;
  Shader local_98;
  
  local_1b8 = (ContextInfo *)local_1a8;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_1b8,
             "${GLSL_VERSION_DECL}\nout highp vec4 v_color;\nvoid main()\n{\n\tgl_Position = vec4(float(gl_VertexID) * 0.5, float(gl_VertexID+1) * 0.5, 0.0, 1.0);\n\tv_color = vec4(float(gl_VertexID), 1.0, 0.0, 1.0);\n}\n"
             ,"");
  local_1d8[0] = (Context *)local_1c8;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_1d8,
             "${GLSL_VERSION_DECL}\nin highp vec4 v_color;\nlayout(location=0) out highp vec4 o_color;\nvoid main()\n{\n\to_color = v_color;\n}\n"
             ,"");
  iVar4 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  code = (this->super_TestCase).super_TestCase.super_TestNode.m_testCtx;
  glu::CallLogWrapper::CallLogWrapper
            (&local_238,(Functions *)CONCAT44(extraout_var,iVar4),code->m_log);
  pTVar3 = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  local_158._0_8_ = local_158 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_158," // ERROR: ","");
  tcu::ResultCollector::ResultCollector(&local_e8,pTVar3,(string *)local_158);
  if ((undefined1 *)local_158._0_8_ != local_158 + 0x10) {
    operator_delete((void *)local_158._0_8_,local_158._16_8_ + 1);
  }
  glu::Shader::Shader((Shader *)local_158,((this->super_TestCase).m_context)->m_renderCtx,
                      SHADERTYPE_VERTEX);
  glu::Shader::Shader(&local_98,((this->super_TestCase).m_context)->m_renderCtx,SHADERTYPE_FRAGMENT)
  ;
  Functional::(anonymous_namespace)::specializeShader_abi_cxx11_
            (&local_178,(_anonymous_namespace_ *)(this->super_TestCase).m_context,
             (Context *)local_1b8,(char *)code);
  Functional::(anonymous_namespace)::specializeShader_abi_cxx11_
            ((string *)(local_1a8 + 0x10),(_anonymous_namespace_ *)(this->super_TestCase).m_context,
             local_1d8[0],(char *)code);
  local_f0 = local_178._M_dataplus._M_p;
  local_1e0 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_1a8._16_8_;
  glu::Shader::setSources((Shader *)local_158,1,&local_f0,(int *)0x0);
  glu::Shader::setSources(&local_98,1,(char **)&local_1e0,(int *)0x0);
  glu::Shader::compile((Shader *)local_158);
  glu::Shader::compile(&local_98);
  pTVar3 = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  pcVar1 = local_220 + 0x10;
  local_220._0_8_ = pcVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_220,"VtxShader","");
  paVar2 = &local_258.field_2;
  local_258._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_258,"Vertex shader","");
  tcu::ScopedLogSection::ScopedLogSection(&local_260,pTVar3,(string *)local_220,&local_258);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_258._M_dataplus._M_p != paVar2) {
    operator_delete(local_258._M_dataplus._M_p,local_258.field_2._M_allocated_capacity + 1);
  }
  if ((pointer)local_220._0_8_ != pcVar1) {
    operator_delete((void *)local_220._0_8_,local_220._16_8_ + 1);
  }
  glu::operator<<(((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log,
                  (Shader *)local_158);
  tcu::TestLog::endSection(local_260.m_log);
  pTVar3 = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  local_220._0_8_ = pcVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_220,"FrgShader","");
  local_258._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_258,"Fragment shader","");
  tcu::ScopedLogSection::ScopedLogSection(&local_260,pTVar3,(string *)local_220,&local_258);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_258._M_dataplus._M_p != paVar2) {
    operator_delete(local_258._M_dataplus._M_p,local_258.field_2._M_allocated_capacity + 1);
  }
  if ((pointer)local_220._0_8_ != pcVar1) {
    operator_delete((void *)local_220._0_8_,local_220._16_8_ + 1);
  }
  glu::operator<<(((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log,&local_98)
  ;
  tcu::TestLog::endSection(local_260.m_log);
  if ((local_100 != true) || (local_98.m_info.compileOk == false)) {
    pTVar6 = (TestError *)__cxa_allocate_exception(0x38);
    tcu::TestError::TestError
              (pTVar6,"failed to build shaders",
               "vtxShader.getCompileStatus() && frgShader.getCompileStatus()",
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fProgramStateQueryTests.cpp"
               ,0x186);
    __cxa_throw(pTVar6,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
  }
  local_238.m_enableLog = true;
  pTVar3 = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  local_220._0_8_ = pcVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_220,"Initial","");
  local_258._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_258,"Initial","");
  tcu::ScopedLogSection::ScopedLogSection(&local_260,pTVar3,(string *)local_220,&local_258);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_258._M_dataplus._M_p != paVar2) {
    operator_delete(local_258._M_dataplus._M_p,local_258.field_2._M_allocated_capacity + 1);
  }
  if ((pointer)local_220._0_8_ != pcVar1) {
    operator_delete((void *)local_220._0_8_,local_220._16_8_ + 1);
  }
  glu::Program::Program((Program *)local_220,((this->super_TestCase).m_context)->m_renderCtx);
  deqp::gls::StateQueryUtil::verifyStateProgramInteger
            (&local_e8,&local_238,local_220._8_4_,0x8258,0,this->m_verifier);
  glu::Program::~Program((Program *)local_220);
  tcu::TestLog::endSection(local_260.m_log);
  pTVar3 = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  local_220._0_8_ = pcVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_220,"SetFalse","");
  local_258._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_258,"SetFalse","");
  tcu::ScopedLogSection::ScopedLogSection(&local_260,pTVar3,(string *)local_220,&local_258);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_258._M_dataplus._M_p != paVar2) {
    operator_delete(local_258._M_dataplus._M_p,local_258.field_2._M_allocated_capacity + 1);
  }
  if ((pointer)local_220._0_8_ != pcVar1) {
    operator_delete((void *)local_220._0_8_,local_220._16_8_ + 1);
  }
  glu::Program::Program((Program *)local_220,((this->super_TestCase).m_context)->m_renderCtx);
  local_258._M_dataplus._M_p = local_258._M_dataplus._M_p & 0xffffffff00000000;
  glu::CallLogWrapper::glAttachShader(&local_238,local_220._8_4_,local_158._8_4_);
  glu::CallLogWrapper::glAttachShader(&local_238,local_220._8_4_,local_98.m_shader);
  glu::CallLogWrapper::glProgramParameteri(&local_238,local_220._8_4_,0x8258,0);
  glu::CallLogWrapper::glLinkProgram(&local_238,local_220._8_4_);
  GVar5 = glu::CallLogWrapper::glGetError(&local_238);
  glu::checkError(GVar5,"setup program",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fProgramStateQueryTests.cpp"
                  ,0x19a);
  glu::CallLogWrapper::glGetProgramiv(&local_238,local_220._8_4_,0x8b82,(GLint *)&local_258);
  GVar5 = glu::CallLogWrapper::glGetError(&local_238);
  glu::checkError(GVar5,"query link status",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fProgramStateQueryTests.cpp"
                  ,0x19d);
  if ((int)local_258._M_dataplus._M_p == 1) {
    deqp::gls::StateQueryUtil::verifyStateProgramInteger
              (&local_e8,&local_238,local_220._8_4_,0x8258,0,this->m_verifier);
    glu::Program::~Program((Program *)local_220);
    tcu::TestLog::endSection(local_260.m_log);
    pTVar3 = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
    local_220._0_8_ = pcVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_220,"SetTrue","");
    local_258._M_dataplus._M_p = (pointer)paVar2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_258,"SetTrue","");
    tcu::ScopedLogSection::ScopedLogSection(&local_260,pTVar3,(string *)local_220,&local_258);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_258._M_dataplus._M_p != paVar2) {
      operator_delete(local_258._M_dataplus._M_p,local_258.field_2._M_allocated_capacity + 1);
    }
    if ((pointer)local_220._0_8_ != pcVar1) {
      operator_delete((void *)local_220._0_8_,local_220._16_8_ + 1);
    }
    glu::Program::Program((Program *)local_220,((this->super_TestCase).m_context)->m_renderCtx);
    local_258._M_dataplus._M_p = local_258._M_dataplus._M_p & 0xffffffff00000000;
    glu::CallLogWrapper::glAttachShader(&local_238,local_220._8_4_,local_158._8_4_);
    glu::CallLogWrapper::glAttachShader(&local_238,local_220._8_4_,local_98.m_shader);
    glu::CallLogWrapper::glProgramParameteri(&local_238,local_220._8_4_,0x8258,1);
    glu::CallLogWrapper::glLinkProgram(&local_238,local_220._8_4_);
    GVar5 = glu::CallLogWrapper::glGetError(&local_238);
    glu::checkError(GVar5,"setup program",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fProgramStateQueryTests.cpp"
                    ,0x1ad);
    glu::CallLogWrapper::glGetProgramiv(&local_238,local_220._8_4_,0x8b82,(GLint *)&local_258);
    GVar5 = glu::CallLogWrapper::glGetError(&local_238);
    glu::checkError(GVar5,"query link status",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fProgramStateQueryTests.cpp"
                    ,0x1b0);
    if ((int)local_258._M_dataplus._M_p == 1) {
      deqp::gls::StateQueryUtil::verifyStateProgramInteger
                (&local_e8,&local_238,local_220._8_4_,0x8258,1,this->m_verifier);
      glu::Program::~Program((Program *)local_220);
      tcu::TestLog::endSection(local_260.m_log);
      tcu::ResultCollector::setTestContextResult
                (&local_e8,(this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1a8._16_8_ != &local_188) {
        operator_delete((void *)local_1a8._16_8_,local_188._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_178._M_dataplus._M_p != &local_178.field_2) {
        operator_delete(local_178._M_dataplus._M_p,local_178.field_2._M_allocated_capacity + 1);
      }
      glu::Shader::~Shader(&local_98);
      glu::Shader::~Shader((Shader *)local_158);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_e8.m_message._M_dataplus._M_p != &local_e8.m_message.field_2) {
        operator_delete(local_e8.m_message._M_dataplus._M_p,
                        local_e8.m_message.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_e8.m_prefix._M_dataplus._M_p != &local_e8.m_prefix.field_2) {
        operator_delete(local_e8.m_prefix._M_dataplus._M_p,
                        local_e8.m_prefix.field_2._M_allocated_capacity + 1);
      }
      glu::CallLogWrapper::~CallLogWrapper(&local_238);
      if (local_1d8[0] != (Context *)local_1c8) {
        operator_delete(local_1d8[0],(ulong)((long)(Platform **)local_1c8._0_8_ + 1));
      }
      if (local_1b8 != (ContextInfo *)local_1a8) {
        operator_delete(local_1b8,(ulong)((long)(Platform **)local_1a8._0_8_ + 1));
      }
      return STOP;
    }
    pTVar6 = (TestError *)__cxa_allocate_exception(0x38);
    tcu::TestError::TestError
              (pTVar6,"failed to link program","linkStatus == GL_TRUE",
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fProgramStateQueryTests.cpp"
               ,0x1b2);
    __cxa_throw(pTVar6,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
  }
  pTVar6 = (TestError *)__cxa_allocate_exception(0x38);
  tcu::TestError::TestError
            (pTVar6,"failed to link program","linkStatus == GL_TRUE",
             "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fProgramStateQueryTests.cpp"
             ,0x19f);
  __cxa_throw(pTVar6,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
}

Assistant:

ProgramSeparableCase::IterateResult ProgramSeparableCase::iterate (void)
{
	const string				vtxTemplate	=	"${GLSL_VERSION_DECL}\n"
												"out highp vec4 v_color;\n"
												"void main()\n"
												"{\n"
												"	gl_Position = vec4(float(gl_VertexID) * 0.5, float(gl_VertexID+1) * 0.5, 0.0, 1.0);\n"
												"	v_color = vec4(float(gl_VertexID), 1.0, 0.0, 1.0);\n"
												"}\n";
	const string				fragTemplate =	"${GLSL_VERSION_DECL}\n"
												"in highp vec4 v_color;\n"
												"layout(location=0) out highp vec4 o_color;\n"
												"void main()\n"
												"{\n"
												"	o_color = v_color;\n"
												"}\n";

	glu::CallLogWrapper			gl				(m_context.getRenderContext().getFunctions(), m_testCtx.getLog());
	tcu::ResultCollector		result			(m_testCtx.getLog(), " // ERROR: ");
	glu::Shader					vtxShader		(m_context.getRenderContext(), glu::SHADERTYPE_VERTEX);
	glu::Shader					frgShader		(m_context.getRenderContext(), glu::SHADERTYPE_FRAGMENT);

	const std::string			vStr			= specializeShader(m_context, vtxTemplate.c_str());
	const std::string			fStr			= specializeShader(m_context, fragTemplate.c_str());
	const char* const			vtxSourcePtr	= vStr.c_str();
	const char* const			fragSourcePtr	= fStr.c_str();

	vtxShader.setSources(1, &vtxSourcePtr, DE_NULL);
	frgShader.setSources(1, &fragSourcePtr, DE_NULL);

	vtxShader.compile();
	frgShader.compile();

	{
		const tcu::ScopedLogSection section(m_testCtx.getLog(), "VtxShader", "Vertex shader");
		m_testCtx.getLog() << vtxShader;
	}

	{
		const tcu::ScopedLogSection section(m_testCtx.getLog(), "FrgShader", "Fragment shader");
		m_testCtx.getLog() << frgShader;
	}

	TCU_CHECK_MSG(vtxShader.getCompileStatus() && frgShader.getCompileStatus(), "failed to build shaders");

	gl.enableLogging(true);

	{
		const tcu::ScopedLogSection	section	(m_testCtx.getLog(), "Initial", "Initial");
		glu::Program				program	(m_context.getRenderContext());

		verifyStateProgramInteger(result, gl, program.getProgram(), GL_PROGRAM_SEPARABLE, 0, m_verifier);
	}

	{
		const tcu::ScopedLogSection section		(m_testCtx.getLog(), "SetFalse", "SetFalse");
		glu::Program				program		(m_context.getRenderContext());
		int							linkStatus	= 0;

		gl.glAttachShader(program.getProgram(), vtxShader.getShader());
		gl.glAttachShader(program.getProgram(), frgShader.getShader());
		gl.glProgramParameteri(program.getProgram(), GL_PROGRAM_SEPARABLE, GL_FALSE);
		gl.glLinkProgram(program.getProgram());
		GLU_EXPECT_NO_ERROR(gl.glGetError(), "setup program");

		gl.glGetProgramiv(program.getProgram(), GL_LINK_STATUS, &linkStatus);
		GLU_EXPECT_NO_ERROR(gl.glGetError(), "query link status");

		TCU_CHECK_MSG(linkStatus == GL_TRUE, "failed to link program");

		verifyStateProgramInteger(result, gl, program.getProgram(), GL_PROGRAM_SEPARABLE, 0, m_verifier);
	}

	{
		const tcu::ScopedLogSection section		(m_testCtx.getLog(), "SetTrue", "SetTrue");
		glu::Program				program		(m_context.getRenderContext());
		int							linkStatus	= 0;

		gl.glAttachShader(program.getProgram(), vtxShader.getShader());
		gl.glAttachShader(program.getProgram(), frgShader.getShader());
		gl.glProgramParameteri(program.getProgram(), GL_PROGRAM_SEPARABLE, GL_TRUE);
		gl.glLinkProgram(program.getProgram());
		GLU_EXPECT_NO_ERROR(gl.glGetError(), "setup program");

		gl.glGetProgramiv(program.getProgram(), GL_LINK_STATUS, &linkStatus);
		GLU_EXPECT_NO_ERROR(gl.glGetError(), "query link status");

		TCU_CHECK_MSG(linkStatus == GL_TRUE, "failed to link program");

		verifyStateProgramInteger(result, gl, program.getProgram(), GL_PROGRAM_SEPARABLE, GL_TRUE, m_verifier);
	}

	result.setTestContextResult(m_testCtx);
	return STOP;
}